

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

void __thiscall
spirv_cross::CompilerGLSL::fixup_io_block_patch_primitive_qualifiers
          (CompilerGLSL *this,SPIRVariable *var)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  SPIRType *pSVar4;
  Decoration decoration;
  uint index;
  uint32_t index_00;
  
  pSVar4 = Variant::get<spirv_cross::SPIRType>
                     ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                      *(uint *)&(var->super_IVariant).field_0xc);
  bVar2 = Compiler::has_decoration
                    (&this->super_Compiler,(ID)(pSVar4->super_IVariant).self.id,DecorationBlock);
  if (bVar2) {
    uVar1 = (uint)(pSVar4->member_types).
                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size;
    bVar2 = uVar1 != 0;
    if (uVar1 == 0) {
LAB_00259106:
      decoration = DecorationRelaxedPrecision;
    }
    else {
      decoration = DecorationPatch;
      bVar3 = Compiler::has_member_decoration
                        (&this->super_Compiler,(TypeID)(pSVar4->super_IVariant).self.id,0,
                         DecorationPatch);
      if (!bVar3) {
        index = 1;
        do {
          decoration = DecorationPerPrimitiveEXT;
          bVar3 = Compiler::has_member_decoration
                            (&this->super_Compiler,(TypeID)(pSVar4->super_IVariant).self.id,
                             index - 1,DecorationPerPrimitiveEXT);
          if (bVar3) break;
          bVar2 = index < uVar1;
          if (index == uVar1) goto LAB_00259106;
          decoration = DecorationPatch;
          bVar3 = Compiler::has_member_decoration
                            (&this->super_Compiler,(TypeID)(pSVar4->super_IVariant).self.id,index,
                             DecorationPatch);
          index = index + 1;
        } while (!bVar3);
      }
    }
    if (bVar2) {
      index_00 = 0;
      Compiler::set_decoration(&this->super_Compiler,(ID)(var->super_IVariant).self.id,decoration,0)
      ;
      if (uVar1 != 0) {
        do {
          Compiler::unset_member_decoration
                    (&this->super_Compiler,(TypeID)(pSVar4->super_IVariant).self.id,index_00,
                     decoration);
          index_00 = index_00 + 1;
        } while (uVar1 != index_00);
      }
    }
  }
  return;
}

Assistant:

void CompilerGLSL::fixup_io_block_patch_primitive_qualifiers(const SPIRVariable &var)
{
	// Works around weird behavior in glslangValidator where
	// a patch out block is translated to just block members getting the decoration.
	// To make glslang not complain when we compile again, we have to transform this back to a case where
	// the variable itself has Patch decoration, and not members.
	// Same for perprimitiveEXT.
	auto &type = get<SPIRType>(var.basetype);
	if (has_decoration(type.self, DecorationBlock))
	{
		uint32_t member_count = uint32_t(type.member_types.size());
		Decoration promoted_decoration = {};
		bool do_promote_decoration = false;
		for (uint32_t i = 0; i < member_count; i++)
		{
			if (has_member_decoration(type.self, i, DecorationPatch))
			{
				promoted_decoration = DecorationPatch;
				do_promote_decoration = true;
				break;
			}
			else if (has_member_decoration(type.self, i, DecorationPerPrimitiveEXT))
			{
				promoted_decoration = DecorationPerPrimitiveEXT;
				do_promote_decoration = true;
				break;
			}
		}

		if (do_promote_decoration)
		{
			set_decoration(var.self, promoted_decoration);
			for (uint32_t i = 0; i < member_count; i++)
				unset_member_decoration(type.self, i, promoted_decoration);
		}
	}
}